

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall Highs::completeSolutionFromDiscreteAssignment(Highs *this)

{
  HighsSolution *this_00;
  vector<double,_std::allocator<double>_> *__x;
  vector<double,_std::allocator<double>_> *__x_00;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *__x_01;
  double *pdVar1;
  double primal;
  double lower;
  HighsInt HVar2;
  pointer pdVar3;
  pointer pHVar4;
  bool bVar5;
  int iVar6;
  HighsStatus HVar7;
  HighsVarType type;
  char *format;
  long lVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  double integer_infeasibility;
  double col_infeasibility;
  vector<HighsVarType,_std::allocator<HighsVarType>_> save_integrality;
  vector<double,_std::allocator<double>_> save_col_upper;
  vector<double,_std::allocator<double>_> save_col_lower;
  double local_c0;
  pointer local_b8;
  pointer local_b0;
  double local_a8;
  double local_a0;
  vector<HighsVarType,_std::allocator<HighsVarType>_> local_98;
  vector<double,_std::allocator<double>_> local_80;
  vector<double,_std::allocator<double>_> local_68;
  string local_50;
  
  this_00 = &this->solution_;
  bVar5 = HighsSolution::hasUndefined(this_00);
  if (!bVar5) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    assessLpPrimalSolution
              (&local_50,&this->options_,&(this->model_).lp_,this_00,(bool *)&local_68,
               (bool *)&local_80,(bool *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((char)local_98.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
              super__Vector_impl_data._M_start != '\0') {
      return kOk;
    }
  }
  __x = &(this->model_).lp_.col_lower_;
  std::vector<double,_std::allocator<double>_>::vector(&local_68,__x);
  __x_00 = &(this->model_).lp_.col_upper_;
  std::vector<double,_std::allocator<double>_>::vector(&local_80,__x_00);
  __x_01 = &(this->model_).lp_.integrality_;
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::vector(&local_98,__x_01);
  iVar6 = (this->model_).lp_.num_col_;
  if (iVar6 < 1) {
    iVar9 = 0;
  }
  else {
    local_b0 = (this->model_).lp_.integrality_.
               super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
               super__Vector_impl_data._M_finish;
    local_b8 = (this->model_).lp_.integrality_.
               super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
               super__Vector_impl_data._M_start;
    lVar8 = 0;
    uVar11 = 0;
    iVar10 = 0;
    do {
      pdVar3 = (this->solution_).col_value.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      primal = pdVar3[lVar8];
      lower = (this->model_).lp_.col_lower_.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar8];
      pdVar3[lVar8] = lower;
      type = (this->model_).lp_.integrality_.
             super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
             super__Vector_impl_data._M_start[lVar8];
      if (type != kContinuous) {
        if (primal < INFINITY) {
          if (local_b0 == local_b8) {
            type = kContinuous;
          }
          local_a0 = 0.0;
          local_c0 = 0.0;
          local_a8 = primal;
          assessColPrimalSolution
                    (&this->options_,primal,lower,
                     (__x_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar8],type,&local_a0,&local_c0);
          pdVar1 = &(this->options_).super_HighsOptionsStruct.mip_feasibility_tolerance;
          if (local_c0 < *pdVar1 || local_c0 == *pdVar1) {
            uVar11 = (ulong)((int)uVar11 + 1);
            (__x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar8] = local_a8;
            (__x_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar8] = local_a8;
            (__x_01->super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar8] = kContinuous;
          }
          else {
            iVar10 = iVar10 + 1;
          }
          iVar6 = (this->model_).lp_.num_col_;
        }
        else {
          iVar10 = iVar10 + 1;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar6);
    iVar9 = (int)uVar11 + iVar10;
    if (iVar10 != 0) {
      iVar6 = (int)uVar11 * 10;
      format = 
      "Attempting to find feasible solution by solving MIP for user-supplied values of %d / %d discrete variables\n"
      ;
      if (iVar6 < iVar9) {
        format = 
        "User-supplied values fix only %d / %d discrete variables, so attempt to complete a feasible solution may be expensive\n"
        ;
      }
      bVar5 = true;
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,
                   (uint)(iVar6 < iVar9) * 3 + kInfo,format,uVar11);
      goto LAB_0020aaae;
    }
  }
  if (iVar6 == iVar9) {
    bVar5 = false;
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                 "User-supplied values of discrete variables cannot yield feasible solution\n");
  }
  else {
    pHVar4 = (this->model_).lp_.integrality_.
             super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->model_).lp_.integrality_.
        super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
        super__Vector_impl_data._M_finish != pHVar4) {
      (this->model_).lp_.integrality_.
      super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
      super__Vector_impl_data._M_finish = pHVar4;
    }
    bVar5 = true;
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                 "Attempting to find feasible solution by solving LP for user-supplied values of discrete variables\n"
                );
  }
LAB_0020aaae:
  HighsSolution::clear(this_00);
  if (bVar5) {
    HVar2 = (this->options_).super_HighsOptionsStruct.mip_max_nodes;
    (this->options_).super_HighsOptionsStruct.mip_max_nodes =
         (this->options_).super_HighsOptionsStruct.mip_max_start_nodes;
    HighsBasis::clear(&this->basis_);
    HVar7 = run(this);
    (this->options_).super_HighsOptionsStruct.mip_max_nodes = HVar2;
    bVar5 = HVar7 == kError;
  }
  else {
    bVar5 = false;
  }
  std::vector<double,_std::allocator<double>_>::operator=(__x,&local_68);
  std::vector<double,_std::allocator<double>_>::operator=(__x_00,&local_80);
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator=(__x_01,&local_98);
  HVar7 = kOk;
  if (bVar5) {
    HVar7 = kError;
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "Highs::run() error trying to find feasible solution\n");
  }
  if ((void *)CONCAT71(local_98.super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
                       _M_impl.super__Vector_impl_data._M_start._1_7_,
                       (char)local_98.
                             super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl
                             .super__Vector_impl_data._M_start) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_98.
                                     super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     (char)local_98.
                                           super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
                                           ._M_impl.super__Vector_impl_data._M_start));
  }
  if (local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return HVar7;
}

Assistant:

HighsStatus Highs::completeSolutionFromDiscreteAssignment() {
  // Determine whether the current solution of a MIP is feasible and,
  // if not, try to assign values to continuous variables and discrete
  // variables not at integer values to achieve a feasible
  // solution. Valuable in the case where users make a heuristic
  // (partial) assignment of discrete variables
  assert(model_.isMip() && solution_.value_valid);
  HighsLp& lp = model_.lp_;
  // Determine whether the solution contains undefined values, in
  // order to decide whether to check its feasibility
  const bool contains_undefined_values = solution_.hasUndefined();
  if (!contains_undefined_values) {
    bool valid, integral, feasible;
    // Determine whether this solution is integer feasible
    HighsStatus return_status = assessLpPrimalSolution(
        "", options_, lp, solution_, valid, integral, feasible);
    assert(return_status != HighsStatus::kError);
    assert(valid);
    // If the current solution is integer feasible, then it can be
    // used by MIP solver to get a primal bound
    if (feasible) return HighsStatus::kOk;
  }
  // Save the column bounds and integrality in preparation for fixing
  // the discrete variables when user-supplied values are
  // integer
  std::vector<double> save_col_lower = lp.col_lower_;
  std::vector<double> save_col_upper = lp.col_upper_;
  std::vector<HighsVarType> save_integrality = lp.integrality_;
  const bool have_integrality = (lp.integrality_.size() != 0);
  assert(have_integrality);
  // Count the number of fixed and unfixed discrete variables
  HighsInt num_fixed_discrete_variable = 0;
  HighsInt num_unfixed_discrete_variable = 0;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    const double primal = solution_.col_value[iCol];
    // Default value is lower bound, unless primal is integer for a
    // discrete variable
    solution_.col_value[iCol] = lp.col_lower_[iCol];
    if (lp.integrality_[iCol] == HighsVarType::kContinuous) continue;
    // Fix discrete variable if its value is defined and integer
    if (primal == kHighsUndefined) {
      num_unfixed_discrete_variable++;
    } else {
      const double lower = lp.col_lower_[iCol];
      const double upper = lp.col_upper_[iCol];
      const HighsVarType type =
          have_integrality ? lp.integrality_[iCol] : HighsVarType::kContinuous;
      double col_infeasibility = 0;
      double integer_infeasibility = 0;
      assessColPrimalSolution(options_, primal, lower, upper, type,
                              col_infeasibility, integer_infeasibility);
      if (integer_infeasibility > options_.mip_feasibility_tolerance) {
        num_unfixed_discrete_variable++;
      } else {
        // Variable is integer feasible, so fix it at this value and
        // remove its integrality
        num_fixed_discrete_variable++;
        lp.col_lower_[iCol] = primal;
        lp.col_upper_[iCol] = primal;
        lp.integrality_[iCol] = HighsVarType::kContinuous;
      }
    }
  }
  assert(!solution_.hasUndefined());
  const HighsInt num_discrete_variable =
      num_unfixed_discrete_variable + num_fixed_discrete_variable;
  const HighsInt num_continuous_variable = lp.num_col_ - num_discrete_variable;
  assert(num_continuous_variable >= 0);
  bool call_run = true;
  const bool few_fixed_discrete_variables =
      10 * num_fixed_discrete_variable < num_discrete_variable;
  if (num_unfixed_discrete_variable == 0) {
    // Solution is integer valued
    if (num_continuous_variable == 0) {
      // There are no continuous variables, so no feasible solution can be
      // deduced
      highsLogUser(options_.log_options, HighsLogType::kInfo,
                   "User-supplied values of discrete variables cannot yield "
                   "feasible solution\n");
      call_run = false;
    } else {
      // Solve an LP, so clear all integrality
      lp.integrality_.clear();
      highsLogUser(
          options_.log_options, HighsLogType::kInfo,
          "Attempting to find feasible solution "
          "by solving LP for user-supplied values of discrete variables\n");
    }
  } else {
    // There are unfixed discrete variables
    if (few_fixed_discrete_variables) {
      // Too few discrete variables are fixed so warn, but still
      // attempt to complete a feasible solution
      highsLogUser(
          options_.log_options, HighsLogType::kWarning,
          "User-supplied values fix only %d / %d discrete variables, "
          "so attempt to complete a feasible solution may be expensive\n",
          int(num_fixed_discrete_variable), int(num_discrete_variable));
    } else {
      highsLogUser(options_.log_options, HighsLogType::kInfo,
                   "Attempting to find feasible solution "
                   "by solving MIP for user-supplied values of %d / %d "
                   "discrete variables\n",
                   int(num_fixed_discrete_variable),
                   int(num_discrete_variable));
    }
  }
  HighsStatus return_status = HighsStatus::kOk;
  // Clear the current solution since either the user solution has
  // been used to fix (a subset of) discrete variables - so a valid
  // solution will be obtained from run() if the local model is
  // feasible - or it's not worth using the user solution
  solution_.clear();
  if (call_run) {
    // Solve the model, using mip_max_start_nodes for
    // mip_max_nodes...
    const HighsInt mip_max_nodes = options_.mip_max_nodes;
    options_.mip_max_nodes = options_.mip_max_start_nodes;
    // Solve the model
    basis_.clear();
    return_status = this->run();
    // ... remembering to recover the original value of mip_max_nodes
    options_.mip_max_nodes = mip_max_nodes;
  }
  // Recover the column bounds and integrality
  lp.col_lower_ = save_col_lower;
  lp.col_upper_ = save_col_upper;
  lp.integrality_ = save_integrality;
  // Handle the error return
  if (return_status == HighsStatus::kError) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Highs::run() error trying to find feasible solution\n");
    return HighsStatus::kError;
  }
  return HighsStatus::kOk;
}